

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

BOOL GetExitCodeProcess(HANDLE hProcess,LPDWORD lpExitCode)

{
  PAL_ERROR PVar1;
  undefined8 in_RAX;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  undefined8 local_28;
  DWORD dwExitCode;
  PROCESS_STATE ps;
  
  if (PAL_InitializeChakraCoreCalled) {
    local_28 = in_RAX;
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    if (lpExitCode == (LPDWORD)0x0) {
      PVar1 = 0x57;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001e062b;
    }
    else {
      PVar1 = PROCGetProcessStatus
                        (pThread,hProcess,(PROCESS_STATE *)((long)&local_28 + 4),(DWORD *)&local_28)
      ;
      if (PVar1 == 0) {
        if (local_28._4_4_ == 3) {
          *lpExitCode = (DWORD)local_28;
        }
        else {
          *lpExitCode = 0x103;
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","GetExitCodeProcess",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x445);
        fprintf(_stderr,"Couldn\'t get process status information!\n");
      }
    }
    if (PVar1 != 0) {
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)(PVar1 == 0);
    }
  }
LAB_001e062b:
  abort();
}

Assistant:

BOOL
PALAPI
GetExitCodeProcess(
    IN HANDLE hProcess,
    IN LPDWORD lpExitCode)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    DWORD dwExitCode;
    PROCESS_STATE ps;

    PERF_ENTRY(GetExitCodeProcess);
    ENTRY("GetExitCodeProcess(hProcess = %p, lpExitCode = %p)\n",
          hProcess, lpExitCode);

    pThread = InternalGetCurrentThread();

    if(NULL == lpExitCode)
    {
        WARN("Got NULL lpExitCode\n");
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    palError = PROCGetProcessStatus(
        pThread,
        hProcess,
        &ps,
        &dwExitCode
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Couldn't get process status information!\n");
        goto done;
    }

    if( PS_DONE == ps )
    {
        *lpExitCode = dwExitCode;
    }
    else
    {
        *lpExitCode = STILL_ACTIVE;
    }

done:

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("GetExitCodeProcess returns BOOL %d\n", NO_ERROR == palError);
    PERF_EXIT(GetExitCodeProcess);

    return NO_ERROR == palError;
}